

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Sprs_array_count_sketch(int s_a,int size_k,int *g_k,int *g_w)

{
  Integer IVar1;
  Integer gw;
  Integer gk;
  
  IVar1 = pnga_sprs_array_count_sketch((long)s_a,(long)size_k,&gk,&gw,1);
  *g_k = (int)gk;
  *g_w = (int)gw;
  return (int)IVar1;
}

Assistant:

int NGA_Sprs_array_count_sketch(int s_a, int size_k, int *g_k, int *g_w)
{
  Integer sa = (Integer)s_a;
  Integer size = (Integer)size_k;
  Integer gk;
  Integer gw;
  int ret = (int)wnga_sprs_array_count_sketch(sa, size, &gk, &gw, 1);
  *g_k = (int)gk;
  *g_w = (int)gw;
  return ret;
}